

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

GCtab * newtab(lua_State *L,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint64_t uVar2;
  void *pvVar3;
  Node *nilnode_1;
  Node *nilnode;
  GCtab *t;
  uint32_t hbits_local;
  uint32_t asize_local;
  lua_State *L_local;
  Node *node;
  uint32_t hsize;
  
  if ((asize == 0) || (0x10 < asize)) {
    nilnode = (Node *)lj_mem_newgco(L,0x40);
    *(undefined1 *)((long)&nilnode->key + 1) = 0xb;
    *(undefined1 *)((long)&nilnode->key + 2) = 0xff;
    *(undefined1 *)((long)&nilnode->key + 3) = 0;
    (nilnode->next).ptr64 = 0;
    nilnode[1].key.u64 = 0;
    nilnode[2].val.field_4.i = 0;
    nilnode[2].val.field_4.it = 0;
    uVar2 = (L->glref).ptr64 + 0xf8;
    nilnode[1].next.ptr64 = uVar2;
    nilnode[2].key.u64 = uVar2;
    if (asize != 0) {
      if (0x8000001 < asize) {
        lj_err_msg(L,LJ_ERR_TABOV);
      }
      pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(ulong)asize << 3);
      (nilnode->next).ptr64 = (uint64_t)pvVar3;
      nilnode[2].val.u32.lo = asize;
    }
  }
  else {
    nilnode = (Node *)lj_mem_newgco(L,(ulong)asize * 8 + 0x40);
    *(undefined1 *)((long)&nilnode->key + 1) = 0xb;
    *(undefined1 *)((long)&nilnode->key + 2) = 0xff;
    *(char *)((long)&nilnode->key + 3) = (char)asize;
    (nilnode->next).ptr64 = (uint64_t)&nilnode[2].next;
    nilnode[1].key.u64 = 0;
    nilnode[2].val.u32.lo = asize;
    nilnode[2].val.field_4.it = 0;
    uVar2 = (L->glref).ptr64 + 0xf8;
    nilnode[1].next.ptr64 = uVar2;
    nilnode[2].key.u64 = uVar2;
  }
  if (hbits != 0) {
    if (0x1a < hbits) {
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar1 = 1 << ((byte)hbits & 0x1f);
    pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(ulong)uVar1 * 0x18);
    nilnode[1].next.ptr64 = (uint64_t)pvVar3;
    nilnode[2].key.u64 = (uint64_t)((long)pvVar3 + (ulong)uVar1 * 0x18);
    nilnode[2].val.field_4.it = uVar1 - 1;
  }
  return (GCtab *)nilnode;
}

Assistant:

static GCtab *newtab(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t;
  /* First try to colocate the array part. */
  if (LJ_MAX_COLOSIZE != 0 && asize > 0 && asize <= LJ_MAX_COLOSIZE) {
    Node *nilnode;
    lj_assertL((sizeof(GCtab) & 7) == 0, "bad GCtab size");
    t = (GCtab *)lj_mem_newgco(L, sizetabcolo(asize));
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = (int8_t)asize;
    setmref(t->array, (TValue *)((char *)t + sizeof(GCtab)));
    setgcrefnull(t->metatable);
    t->asize = asize;
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
  } else {  /* Otherwise separately allocate the array part. */
    Node *nilnode;
    t = lj_mem_newobj(L, GCtab);
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = 0;
    setmref(t->array, NULL);
    setgcrefnull(t->metatable);
    t->asize = 0;  /* In case the array allocation fails. */
    t->hmask = 0;
    nilnode = &G(L)->nilnode;
    setmref(t->node, nilnode);
#if LJ_GC64
    setmref(t->freetop, nilnode);
#endif
    if (asize > 0) {
      if (asize > LJ_MAX_ASIZE)
	lj_err_msg(L, LJ_ERR_TABOV);
      setmref(t->array, lj_mem_newvec(L, asize, TValue));
      t->asize = asize;
    }
  }
  if (hbits)
    newhpart(L, t, hbits);
  return t;
}